

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  ImVec2 local_28;
  ImGuiGroupData *local_20;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  group_data = (ImGuiGroupData *)GImGui->CurrentWindow;
  ImVector<ImGuiGroupData>::resize(&GImGui->GroupStack,(GImGui->GroupStack).Size + 1);
  local_20 = ImVector<ImGuiGroupData>::back((ImVector<ImGuiGroupData> *)&window[0xf].InnerRect);
  local_20->WindowID = (ImGuiID)(group_data->BackupCursorPos).y;
  local_20->BackupCursorPos = *(ImVec2 *)&group_data[5].BackupActiveIdIsAlive;
  local_20->BackupCursorMaxPos = *(ImVec2 *)&group_data[6].BackupCursorMaxPos.y;
  (local_20->BackupIndent).x = group_data[7].BackupCursorPos.y;
  (local_20->BackupGroupOffset).x = group_data[7].BackupCursorMaxPos.y;
  local_20->BackupCurrLineSize = *(ImVec2 *)&group_data[6].BackupCurrLineSize.y;
  local_20->BackupCurrLineTextBaseOffset = (float)group_data[7].WindowID;
  local_20->BackupActiveIdIsAlive = (ImGuiID)window[0xf].WindowPadding.x;
  local_20->BackupHoveredIdIsAlive = window[0xf].ContentSize.x != 0.0;
  local_20->BackupActiveIdPreviousFrameIsAlive = (bool)(*(byte *)&window[0xf].ScrollbarSizes.y & 1);
  local_20->EmitItem = true;
  group_data[7].BackupCursorMaxPos.y =
       ((float)group_data[5].BackupActiveIdIsAlive - group_data[1].BackupGroupOffset.x) -
       group_data[7].BackupCursorMaxPos.x;
  group_data[7].BackupCursorPos.y = group_data[7].BackupCursorMaxPos.y;
  *(undefined8 *)&group_data[6].BackupCursorMaxPos.y =
       *(undefined8 *)&group_data[5].BackupActiveIdIsAlive;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  *(ImVec2 *)&group_data[6].BackupCurrLineSize.y = local_28;
  if (((uint)window[0x14].ScrollbarSizes.y & 1) != 0) {
    window[0x14].SetWindowPosVal.y = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}